

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamAttributes::append
          (QXmlStreamAttributes *this,QString *namespaceUri,QString *name,QString *value)

{
  long lVar1;
  QXmlStreamAttribute *in_RDI;
  long in_FS_OFFSET;
  rvalue_ref in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QXmlStreamAttribute *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamAttribute::QXmlStreamAttribute
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (QString *)in_RDI);
  QList<QXmlStreamAttribute>::append((QList<QXmlStreamAttribute> *)in_RDI,in_stack_ffffffffffffff48)
  ;
  QXmlStreamAttribute::~QXmlStreamAttribute(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamAttributes::append(const QString &namespaceUri, const QString &name, const QString &value)
{
    append(QXmlStreamAttribute(namespaceUri, name, value));
}